

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::SetNextPlotTicksY
               (double *values,int n_ticks,char **labels,bool show_default,ImPlotYAxis y_axis)

{
  ImPlotContext *pIVar1;
  char (*fmt) [16];
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot == __null) && \"SetNextPlotTicksY() needs to be called before BeginPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa37,
                  "void ImPlot::SetNextPlotTicksY(const double *, int, const char *const *, bool, ImPlotYAxis)"
                 );
  }
  if ((uint)y_axis < 3) {
    (GImPlot->NextPlotData).ShowDefaultTicksY[(uint)y_axis] = show_default;
    fmt = (char (*) [16])0x35aec5;
    if ((pIVar1->NextPlotData).HasFmtY[(uint)y_axis] != false) {
      fmt = (pIVar1->NextPlotData).FmtY + (uint)y_axis;
    }
    AddTicksCustom(values,labels,n_ticks,pIVar1->YTicks + (uint)y_axis,*fmt);
    return;
  }
  __assert_fail("(y_axis >= 0 && y_axis < 3) && \"y_axis needs to be between 0 and IMPLOT_Y_AXES\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa38,
                "void ImPlot::SetNextPlotTicksY(const double *, int, const char *const *, bool, ImPlotYAxis)"
               );
}

Assistant:

void SetNextPlotTicksY(const double* values, int n_ticks, const char* const labels[], bool show_default, ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot == NULL, "SetNextPlotTicksY() needs to be called before BeginPlot()!");
    IM_ASSERT_USER_ERROR(y_axis >= 0 && y_axis < IMPLOT_Y_AXES, "y_axis needs to be between 0 and IMPLOT_Y_AXES");
    gp.NextPlotData.ShowDefaultTicksY[y_axis] = show_default;
    AddTicksCustom(values, labels, n_ticks, gp.YTicks[y_axis], GetFormatY(y_axis));
}